

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_sls_8_pi7(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  uint value;
  
  uVar2 = m68ki_cpu.c_flag;
  uVar1 = m68ki_cpu.not_z_flag;
  addr_in = m68ki_cpu.dar[0xf];
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 2;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  value = 0;
  if (uVar1 == 0) {
    value = 0xff;
  }
  if ((uVar2 & 0x100) != 0) {
    value = 0xff;
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,value);
  return;
}

Assistant:

static void m68k_op_sls_8_pi7(void)
{
	m68ki_write_8(EA_A7_PI_8(), COND_LS() ? 0xff : 0);
}